

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::addSelection
          (TIntermediate *this,TIntermTyped *cond,TIntermTyped *trueBlock,TIntermTyped *falseBlock,
          TSourceLoc *loc)

{
  TPrecisionQualifier TVar1;
  TIntermNodePair nodePair;
  TSourceLoc *falseB;
  TIntermTyped *trueB;
  TIntermTyped *cond_00;
  bool bVar2;
  int iVar3;
  EShSource EVar4;
  TBasicType t;
  int iVar5;
  TIntermediate *pTVar6;
  __tuple_element_t<0UL,_tuple<TIntermTyped_*,_TIntermTyped_*>_> *ppTVar7;
  __tuple_element_t<1UL,_tuple<TIntermTyped_*,_TIntermTyped_*>_> *ppTVar8;
  undefined4 extraout_var;
  ulong uVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TType *this_00;
  TType *right;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar10;
  undefined4 extraout_var_07;
  TConstUnionArray *this_01;
  TConstUnion *this_02;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TPrecisionQualifier *pTVar11;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TQualifier *pTVar12;
  TPrecisionQualifier local_128;
  TPrecisionQualifier local_124;
  TIntermediate *local_120;
  TIntermSelection *node;
  TIntermAggregate *mix;
  undefined1 local_108 [8];
  TType targetVectorType;
  tuple<glslang::TIntermTyped_*,_glslang::TIntermTyped_*> children;
  TIntermSelection *selection;
  TIntermNodePair pair;
  TSourceLoc *loc_local;
  TIntermTyped *falseBlock_local;
  TIntermTyped *trueBlock_local;
  TIntermTyped *cond_local;
  TIntermediate *this_local;
  undefined4 extraout_var_04;
  
  loc_local = (TSourceLoc *)falseBlock;
  falseBlock_local = trueBlock;
  trueBlock_local = cond;
  cond_local = (TIntermTyped *)this;
  iVar3 = (*(trueBlock->super_TIntermNode)._vptr_TIntermNode[0x20])();
  if ((iVar3 == 0) && (iVar3 = (*(code *)loc_local->name[6]._M_string_length)(), iVar3 == 0)) {
    nodePair.node2 = (TIntermNode *)loc_local;
    nodePair.node1 = &falseBlock_local->super_TIntermNode;
    pTVar6 = (TIntermediate *)addSelection(this,trueBlock_local,nodePair,loc);
    EVar4 = getSource(this);
    if (EVar4 != EShSourceHlsl) {
      return (TIntermTyped *)pTVar6;
    }
    TIntermSelection::setNoShortCircuit((TIntermSelection *)pTVar6);
    return (TIntermTyped *)pTVar6;
  }
  addPairConversion((TIntermediate *)&targetVectorType.spirvType,(TOperator)this,(TIntermTyped *)0x1
                    ,falseBlock_local);
  ppTVar7 = std::get<0ul,glslang::TIntermTyped*,glslang::TIntermTyped*>
                      ((tuple<glslang::TIntermTyped_*,_glslang::TIntermTyped_*> *)
                       &targetVectorType.spirvType);
  falseBlock_local = *ppTVar7;
  ppTVar8 = std::get<1ul,glslang::TIntermTyped*,glslang::TIntermTyped*>
                      ((tuple<glslang::TIntermTyped_*,_glslang::TIntermTyped_*> *)
                       &targetVectorType.spirvType);
  loc_local = (TSourceLoc *)*ppTVar8;
  if ((falseBlock_local == (TIntermTyped *)0x0) ||
     ((__tuple_element_t<1UL,_tuple<TIntermTyped_*,_TIntermTyped_*>_>)loc_local ==
      (__tuple_element_t<1UL,_tuple<TIntermTyped_*,_TIntermTyped_*>_>)0x0)) {
    return (TIntermTyped *)(TIntermediate *)0x0;
  }
  iVar3 = (*(trueBlock_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 200))();
  if ((uVar9 & 1) == 0) {
    iVar3 = (*(falseBlock_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    t = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x38))();
    iVar3 = (*(trueBlock_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x60))();
    TType::TType((TType *)local_108,t,EvqTemporary,iVar3,0,0,false);
    falseBlock_local = addUniShapeConversion(this,EOpMix,(TType *)local_108,falseBlock_local);
    loc_local = (TSourceLoc *)
                addUniShapeConversion(this,EOpMix,(TType *)local_108,(TIntermTyped *)loc_local);
    iVar3 = (*(((TIntermTyped *)loc_local)->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    iVar5 = (*(falseBlock_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_02,iVar3),
                              (TType *)CONCAT44(extraout_var_03,iVar5));
    if (bVar2) {
      this_local = (TIntermediate *)0x0;
    }
    else {
      node = (TIntermSelection *)makeAggregate(this,loc);
      node = (TIntermSelection *)growAggregate(this,(TIntermNode *)node,(TIntermNode *)loc_local);
      node = (TIntermSelection *)
             growAggregate(this,(TIntermNode *)node,&falseBlock_local->super_TIntermNode);
      node = (TIntermSelection *)
             growAggregate(this,(TIntermNode *)node,&trueBlock_local->super_TIntermNode);
      (*(((TIntermAggregate *)node)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
        _vptr_TIntermNode[0x1d])(node,local_108);
      TIntermOperator::setOp((TIntermOperator *)node,EOpMix);
      this_local = (TIntermediate *)node;
    }
    mix._4_4_ = 1;
    TType::~TType((TType *)local_108);
    return (TIntermTyped *)this_local;
  }
  addBiShapeConversion(this,EOpMix,&falseBlock_local,(TIntermTyped **)&loc_local);
  this_00 = (TType *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
  iVar3 = (*(falseBlock_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  right = (TType *)CONCAT44(extraout_var_04,iVar3);
  bVar2 = TType::operator!=(this_00,right);
  if (bVar2) {
    return (TIntermTyped *)(TIntermediate *)0x0;
  }
  iVar3 = (*(trueBlock_local->super_TIntermNode)._vptr_TIntermNode[5])();
  if (((CONCAT44(extraout_var_05,iVar3) != 0) &&
      (iVar3 = (*(falseBlock_local->super_TIntermNode)._vptr_TIntermNode[5])(),
      CONCAT44(extraout_var_06,iVar3) != 0)) &&
     (lVar10 = (*(code *)loc_local->name[1]._M_dataplus.super_allocator_type.allocator)(),
     lVar10 != 0)) {
    iVar3 = (*(trueBlock_local->super_TIntermNode)._vptr_TIntermNode[5])();
    this_01 = TIntermConstantUnion::getConstArray
                        ((TIntermConstantUnion *)CONCAT44(extraout_var_07,iVar3));
    this_02 = TConstUnionArray::operator[](this_01,0);
    bVar2 = TConstUnion::getBConst(this_02);
    if (!bVar2) {
      return (TIntermTyped *)(TIntermediate *)loc_local;
    }
    return (TIntermTyped *)(TIntermediate *)falseBlock_local;
  }
  pTVar6 = (TIntermediate *)TIntermNode::operator_new((TIntermNode *)0xd8,(size_t)right);
  cond_00 = trueBlock_local;
  trueB = falseBlock_local;
  falseB = loc_local;
  iVar3 = (*(falseBlock_local->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  TIntermSelection::TIntermSelection
            ((TIntermSelection *)pTVar6,cond_00,&trueB->super_TIntermNode,(TIntermNode *)falseB,
             (TType *)CONCAT44(extraout_var_08,iVar3));
  local_120 = pTVar6;
  (**(code **)(*(long *)pTVar6 + 8))(pTVar6,loc);
  iVar3 = (*(falseBlock_local->super_TIntermNode)._vptr_TIntermNode[0x21])();
  local_124 = (TPrecisionQualifier)(*(ulong *)(CONCAT44(extraout_var_09,iVar3) + 8) >> 0x19) & 7;
  lVar10 = (*(code *)loc_local->name[6].field_2._M_allocated_capacity)();
  local_128 = (TPrecisionQualifier)(*(ulong *)(lVar10 + 8) >> 0x19) & 7;
  pTVar11 = std::max<glslang::TPrecisionQualifier>(&local_124,&local_128);
  TVar1 = *pTVar11;
  lVar10 = (**(code **)(*(long *)local_120 + 0x108))();
  *(ulong *)(lVar10 + 8) = *(ulong *)(lVar10 + 8) & 0xfffffffff1ffffff | ((ulong)TVar1 & 7) << 0x19;
  iVar3 = (*(trueBlock_local->super_TIntermNode)._vptr_TIntermNode[0x21])();
  bVar2 = TQualifier::isConstant((TQualifier *)CONCAT44(extraout_var_10,iVar3));
  if ((bVar2) &&
     (bVar2 = specConstantPropagates(this,falseBlock_local,(TIntermTyped *)loc_local), bVar2)) {
LAB_00670195:
    pTVar12 = (TQualifier *)(**(code **)(*(long *)local_120 + 0x108))();
    TQualifier::makeSpecConstant(pTVar12);
  }
  else {
    iVar3 = (*(trueBlock_local->super_TIntermNode)._vptr_TIntermNode[0x21])();
    bVar2 = TQualifier::isSpecConstant((TQualifier *)CONCAT44(extraout_var_11,iVar3));
    if (bVar2) {
      iVar3 = (*(falseBlock_local->super_TIntermNode)._vptr_TIntermNode[0x21])();
      bVar2 = TQualifier::isConstant((TQualifier *)CONCAT44(extraout_var_12,iVar3));
      if (bVar2) {
        pTVar12 = (TQualifier *)(*(code *)loc_local->name[6].field_2._M_allocated_capacity)();
        bVar2 = TQualifier::isConstant(pTVar12);
        if (bVar2) goto LAB_00670195;
      }
    }
    pTVar12 = (TQualifier *)(**(code **)(*(long *)local_120 + 0x108))();
    TQualifier::makeTemporary(pTVar12);
  }
  EVar4 = getSource(this);
  if (EVar4 == EShSourceHlsl) {
    TIntermSelection::setNoShortCircuit((TIntermSelection *)local_120);
  }
  return (TIntermTyped *)local_120;
}

Assistant:

TIntermTyped* TIntermediate::addSelection(TIntermTyped* cond, TIntermTyped* trueBlock, TIntermTyped* falseBlock,
                                          const TSourceLoc& loc)
{
    // If it's void, go to the if-then-else selection()
    if (trueBlock->getBasicType() == EbtVoid && falseBlock->getBasicType() == EbtVoid) {
        TIntermNodePair pair = { trueBlock, falseBlock };
        TIntermSelection* selection = addSelection(cond, pair, loc);
        if (getSource() == EShSourceHlsl)
            selection->setNoShortCircuit();

        return selection;
    }

    //
    // Get compatible types.
    //
    auto children = addPairConversion(EOpSequence, trueBlock, falseBlock);
    trueBlock = std::get<0>(children);
    falseBlock = std::get<1>(children);

    if (trueBlock == nullptr || falseBlock == nullptr)
        return nullptr;

    // Handle a vector condition as a mix
    if (!cond->getType().isScalarOrVec1()) {
        TType targetVectorType(trueBlock->getType().getBasicType(), EvqTemporary,
                               cond->getType().getVectorSize());
        // smear true/false operands as needed
        trueBlock = addUniShapeConversion(EOpMix, targetVectorType, trueBlock);
        falseBlock = addUniShapeConversion(EOpMix, targetVectorType, falseBlock);

        // After conversion, types have to match.
        if (falseBlock->getType() != trueBlock->getType())
            return nullptr;

        // make the mix operation
        TIntermAggregate* mix = makeAggregate(loc);
        mix = growAggregate(mix, falseBlock);
        mix = growAggregate(mix, trueBlock);
        mix = growAggregate(mix, cond);
        mix->setType(targetVectorType);
        mix->setOp(EOpMix);

        return mix;
    }

    // Now have a scalar condition...

    // Convert true and false expressions to matching types
    addBiShapeConversion(EOpMix, trueBlock, falseBlock);

    // After conversion, types have to match.
    if (falseBlock->getType() != trueBlock->getType())
        return nullptr;

    // Eliminate the selection when the condition is a scalar and all operands are constant.
    if (cond->getAsConstantUnion() && trueBlock->getAsConstantUnion() && falseBlock->getAsConstantUnion()) {
        if (cond->getAsConstantUnion()->getConstArray()[0].getBConst())
            return trueBlock;
        else
            return falseBlock;
    }

    //
    // Make a selection node.
    //
    TIntermSelection* node = new TIntermSelection(cond, trueBlock, falseBlock, trueBlock->getType());
    node->setLoc(loc);
    node->getQualifier().precision = std::max(trueBlock->getQualifier().precision, falseBlock->getQualifier().precision);

    if ((cond->getQualifier().isConstant() && specConstantPropagates(*trueBlock, *falseBlock)) ||
        (cond->getQualifier().isSpecConstant() && trueBlock->getQualifier().isConstant() &&
                                                 falseBlock->getQualifier().isConstant()))
        node->getQualifier().makeSpecConstant();
    else
        node->getQualifier().makeTemporary();

    if (getSource() == EShSourceHlsl)
        node->setNoShortCircuit();

    return node;
}